

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantTriangleSetTestInstance::compare
          (InvariantTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
          PerPrimitiveVec *primitivesB,int param_3)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  ostringstream *poVar3;
  pointer pPVar4;
  pointer pPVar5;
  TestLog *pTVar6;
  pointer pPVar7;
  pointer pPVar8;
  pointer pPVar9;
  PerPrimitiveVec *pPVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  Vector<tcu::Vector<float,_3>,_3> *b;
  long lVar13;
  int iVar14;
  _Link_type __x;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *this_00;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  Triangle triangle;
  char local_228 [16];
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_218;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e8;
  undefined1 local_1b8 [24];
  _Base_ptr p_Stack_1a0;
  uchar local_198 [4];
  undefined1 local_194 [84];
  ios_base local_140 [272];
  
  pPVar4 = (primitivesA->
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pPVar5 = (primitivesA->
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pTVar6 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  pPVar7 = (primitivesB->
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pPVar8 = (primitivesB->
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_t._M_impl._0_1_ = 0;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_t._M_impl.super__Rb_tree_header._M_header;
  local_218._M_t._M_impl._0_1_ = 0;
  local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (_Link_type)primitivesA;
  iVar14 = 0;
  local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    uVar16 = (long)pPVar7 - (long)pPVar8;
    if (iVar14 == 0) {
      uVar16 = (long)pPVar4 - (long)pPVar5;
    }
    this_00 = &local_218;
    if (iVar14 == 0) {
      this_00 = &local_1e8;
    }
    uVar15 = (uint)(uVar16 >> 6);
    if (0 < (int)uVar15) {
      uVar16 = (ulong)(uVar15 & 0x7fffffff);
      lVar13 = 0x38;
      do {
        pPVar10 = primitivesB;
        if (iVar14 == 0) {
          pPVar10 = primitivesA;
        }
        pPVar9 = (pPVar10->
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1b8._0_8_ = *(undefined8 *)((long)pPVar9->unused_padding + lVar13 + -0x30);
        local_1b8._16_8_ = *(undefined8 *)((long)pPVar9->unused_padding + lVar13 + -0x1c);
        p_Stack_1a0 = *(_Base_ptr *)((long)pPVar9->unused_padding + lVar13 + -0x10);
        local_198 = *(uchar (*) [4])((long)pPVar9->unused_padding + lVar13 + -8);
        local_1b8._12_4_ = *(undefined4 *)((long)pPVar9->unused_padding + lVar13 + -0x20);
        local_1b8._8_4_ = *(undefined4 *)((long)pPVar9->unused_padding + lVar13 + -0x28);
        std::
        __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                  ((_Link_type)local_1b8,local_194);
        __x = (_Link_type)local_1b8;
        std::
        set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
        ::insert(this_00,(value_type *)local_1b8);
        lVar13 = lVar13 + 0x40;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    bVar17 = iVar14 == 0;
    iVar14 = iVar14 + 1;
  } while (bVar17);
  p_Var1 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
  bVar18 = (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
           p_Var1;
  p_Var2 = &local_218._M_t._M_impl.super__Rb_tree_header;
  bVar19 = (_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
           p_Var2;
  bVar17 = bVar18 && bVar19;
  if (!bVar18 || !bVar19) {
    p_Var11 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1
        && (_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           p_Var2) {
      while( true ) {
        __x = (_Link_type)(p_Var12 + 1);
        bVar17 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                           ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var11 + 1),
                            (Vector<tcu::Vector<float,_3>,_3> *)__x);
        if (!bVar17) break;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        bVar18 = (_Rb_tree_header *)p_Var11 == p_Var1;
        p_Var2 = &local_218._M_t._M_impl.super__Rb_tree_header;
        bVar19 = (_Rb_tree_header *)p_Var12 == p_Var2;
        bVar17 = bVar18 && bVar19;
        if (bVar17) goto LAB_00794ae7;
        if (((_Rb_tree_header *)p_Var11 == p_Var1) || ((_Rb_tree_header *)p_Var12 == p_Var2)) break;
      }
    }
    poVar3 = (ostringstream *)(local_1b8 + 8);
    local_1b8._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
               ,0x5a);
    local_228[0] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,local_228,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_140);
    if ((bVar18) ||
       ((!bVar19 &&
        (bVar17 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                  ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                *)(p_Var11 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1),b)
        , !bVar17)))) {
      poVar3 = (ostringstream *)(local_1b8 + 8);
      local_1b8._0_8_ = pTVar6;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
      tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3," exists for second case but not for first",0x29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar3 = (ostringstream *)(local_1b8 + 8);
      local_1b8._0_8_ = pTVar6;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
      tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var11 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3," exists for first case but not for second",0x29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    __x = (_Link_type)&std::__cxx11::ostringstream::VTT;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_140);
    bVar17 = false;
  }
LAB_00794ae7:
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  return bVar17;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog());
	}